

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRHeaderFromMemory(EXRHeader *exr_header,EXRVersion *version,uchar *memory,char **err)

{
  int iVar1;
  char *pcVar2;
  string err_str;
  HeaderInfo info;
  
  if (exr_header == (EXRHeader *)0x0 || memory == (uchar *)0x0) {
    iVar1 = -3;
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
    }
  }
  else {
    info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    info.channels.super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    info.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    info.channels.super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    info.channels.super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tinyexr::anon_struct_128_15_3efe3611::clear(&info);
    err_str._M_dataplus._M_p = (pointer)&err_str.field_2;
    err_str._M_string_length = 0;
    err_str.field_2._M_local_buf[0] = '\0';
    iVar1 = tinyexr::ParseEXRHeader(&info,(bool *)0x0,version,&err_str,memory + 8);
    if (((err != (char **)0x0) && (iVar1 != 0)) && (err_str._M_string_length != 0)) {
      pcVar2 = strdup(err_str._M_dataplus._M_p);
      *err = pcVar2;
    }
    tinyexr::ConvertHeader(exr_header,&info);
    exr_header->tiled = version->tiled;
    std::__cxx11::string::~string((string *)&err_str);
    tinyexr::anon_struct_128_15_3efe3611::~HeaderInfo(&info);
  }
  return iVar1;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRHeader *exr_header, const EXRVersion *version,
                             const unsigned char *memory, const char **err) {
  if (memory == NULL || exr_header == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }

    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[4 + 4];  // skip magic number + version header

  tinyexr::HeaderInfo info;
  info.clear();

  std::string err_str;
  int ret = ParseEXRHeader(&info, NULL, version, &err_str,
                           reinterpret_cast<const unsigned char *>(marker));

  if (ret != TINYEXR_SUCCESS) {
    if (err && !err_str.empty()) {
      (*err) = strdup(err_str.c_str());  // May leak
    }
  }

  ConvertHeader(exr_header, info);

  // transfoer `tiled` from version.
  exr_header->tiled = version->tiled;

  return ret;
}